

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformGradient.cpp
# Opt level: O0

void __thiscall OpenMD::UniformGradient::modifyForces(UniformGradient *this)

{
  bool bVar1;
  SnapshotManager *pSVar2;
  Snapshot *this_00;
  Vector<double,_7U> *this_01;
  long in_RDI;
  RealType RVar3;
  Snapshot *snap;
  MultipoleAdapter ma;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  bool isCharge;
  Vector3d EF;
  Vector3d r;
  Vector3d f;
  Vector3d t;
  RealType fPot;
  RealType U;
  Mat3x3d Q;
  Vector3d D;
  RealType C;
  potVec longRangePotential;
  AtomType *atype;
  Atom *atom;
  Molecule *mol;
  AtomIterator j;
  MoleculeIterator i;
  Snapshot *in_stack_fffffffffffffb48;
  StuntDouble *in_stack_fffffffffffffb50;
  StuntDouble *in_stack_fffffffffffffb58;
  Vector<double,_7U> *v;
  StuntDouble *in_stack_fffffffffffffb60;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffb68;
  SimInfo *in_stack_fffffffffffffb70;
  Molecule *in_stack_fffffffffffffb78;
  Atom *in_stack_fffffffffffffb80;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffb88;
  Atom *in_stack_fffffffffffffbb0;
  Vector3<double> *in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbcf;
  Snapshot *in_stack_fffffffffffffbd0;
  UniformGradient *in_stack_fffffffffffffcb0;
  RectMatrix<double,_3U,_3U> local_2f8 [3];
  MultipoleAdapter local_208 [7];
  FluctuatingChargeAdapter local_1d0;
  FixedChargeAdapter local_1c8 [13];
  byte local_159;
  Vector<double,_7U> *local_e8;
  double local_e0;
  Snapshot *local_78;
  double local_70;
  Vector<double,_7U> local_68;
  AtomType *local_30;
  Atom *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
    initialize(in_stack_fffffffffffffcb0);
  }
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_18);
  local_70 = 0.0;
  Vector<double,_7U>::Vector(&local_68,&local_70);
  Vector3<double>::Vector3((Vector3<double> *)0x1ade5a);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x1ade67);
  Vector3<double>::Vector3((Vector3<double> *)0x1ade74);
  Vector3<double>::Vector3((Vector3<double> *)0x1ade83);
  Vector3<double>::Vector3((Vector3<double> *)0x1ade92);
  Vector3<double>::Vector3((Vector3<double> *)0x1adea1);
  if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
    local_e0 = 0.0;
    local_e8 = (Vector<double,_7U> *)0x0;
    local_20 = SimInfo::beginMolecule
                         (in_stack_fffffffffffffb70,(MoleculeIterator *)in_stack_fffffffffffffb68);
    while (local_20 != (Molecule *)0x0) {
      local_28 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffffb70,
                                     (iterator *)in_stack_fffffffffffffb68);
      while (local_28 != (Atom *)0x0) {
        local_159 = 0;
        local_78 = (Snapshot *)0x0;
        local_30 = Atom::getAtomType(local_28);
        StuntDouble::getPos(in_stack_fffffffffffffb58);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffb50,
                   (Vector3<double> *)in_stack_fffffffffffffb48);
        pSVar2 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
        SnapshotManager::getCurrentSnapshot(pSVar2);
        Snapshot::wrapVector
                  (in_stack_fffffffffffffbd0,
                   (Vector3d *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
        OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb78,
                          (Vector<double,_3U> *)in_stack_fffffffffffffb70);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffb58,
                   (Vector<double,_3U> *)in_stack_fffffffffffffb50);
        OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffb58,
                          (double)in_stack_fffffffffffffb50);
        Vector3<double>::Vector3
                  ((Vector3<double> *)in_stack_fffffffffffffb50,
                   (Vector<double,_3U> *)in_stack_fffffffffffffb48);
        StuntDouble::addElectricField
                  (in_stack_fffffffffffffb60,(Vector3d *)in_stack_fffffffffffffb58);
        FixedChargeAdapter::FixedChargeAdapter(local_1c8,local_30);
        bVar1 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x1ae0ba);
        if (bVar1) {
          local_159 = 1;
          in_stack_fffffffffffffbd0 =
               (Snapshot *)
               FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_fffffffffffffb50);
          local_78 = in_stack_fffffffffffffbd0;
        }
        FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_1d0,local_30);
        in_stack_fffffffffffffbcf =
             FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x1ae141);
        if ((bool)in_stack_fffffffffffffbcf) {
          local_159 = 1;
          RVar3 = StuntDouble::getFlucQPos(in_stack_fffffffffffffb50);
          local_78 = (Snapshot *)((double)local_78 + RVar3);
          in_stack_fffffffffffffbb0 = local_28;
          in_stack_fffffffffffffbb8 =
               (Vector3<double> *)
               dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffb60,
                              (Vector<double,_3U> *)in_stack_fffffffffffffb58);
          StuntDouble::addFlucQFrc(in_stack_fffffffffffffb60,(RealType)in_stack_fffffffffffffb58);
        }
        if ((local_159 & 1) != 0) {
          OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffb58,
                            (double)in_stack_fffffffffffffb50);
          OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffb58,
                            (double)in_stack_fffffffffffffb50);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffb58,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb50);
          StuntDouble::addFrc(in_stack_fffffffffffffb60,(Vector3d *)in_stack_fffffffffffffb58);
          local_e0 = dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffb60,
                                    (Vector<double,_3U> *)in_stack_fffffffffffffb58);
          local_e0 = -local_e0;
          if ((*(byte *)(in_RDI + 0x12) & 1) != 0) {
            StuntDouble::addParticlePot
                      (in_stack_fffffffffffffb60,(RealType *)in_stack_fffffffffffffb58);
          }
          local_e8 = (Vector<double,_7U> *)(local_e0 + (double)local_e8);
        }
        MultipoleAdapter::MultipoleAdapter(local_208,local_30);
        bVar1 = MultipoleAdapter::isDipole((MultipoleAdapter *)in_stack_fffffffffffffbb8);
        if (bVar1) {
          StuntDouble::getDipole(in_stack_fffffffffffffb58);
          OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffb58,
                            (double)in_stack_fffffffffffffb50);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffb58,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb50);
          OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffb78,
                            (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb70);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffb58,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb50);
          StuntDouble::addFrc(in_stack_fffffffffffffb60,(Vector3d *)in_stack_fffffffffffffb58);
          cross<double>(in_stack_fffffffffffffbb8,(Vector3<double> *)in_stack_fffffffffffffbb0);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffb50,
                     (Vector3<double> *)in_stack_fffffffffffffb48);
          StuntDouble::addTrq(in_stack_fffffffffffffb60,(Vector3d *)in_stack_fffffffffffffb58);
          local_e0 = dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffb60,
                                    (Vector<double,_3U> *)in_stack_fffffffffffffb58);
          local_e0 = -local_e0;
          if ((*(byte *)(in_RDI + 0x12) & 1) != 0) {
            StuntDouble::addParticlePot
                      (in_stack_fffffffffffffb60,(RealType *)in_stack_fffffffffffffb58);
          }
          local_e8 = (Vector<double,_7U> *)(local_e0 + (double)local_e8);
        }
        bVar1 = MultipoleAdapter::isQuadrupole((MultipoleAdapter *)in_stack_fffffffffffffbb8);
        if (bVar1) {
          StuntDouble::getQuadrupole(in_stack_fffffffffffffb58);
          OpenMD::operator*(in_stack_fffffffffffffb68,(double)in_stack_fffffffffffffb60);
          SquareMatrix<double,_3>::SquareMatrix
                    ((SquareMatrix<double,_3> *)in_stack_fffffffffffffb50,
                     (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb48);
          SquareMatrix3<double>::operator=
                    ((SquareMatrix3<double> *)in_stack_fffffffffffffb58,
                     (SquareMatrix<double,_3> *)in_stack_fffffffffffffb50);
          SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x1ae515);
          RectMatrix<double,_3U,_3U>::~RectMatrix(local_2f8);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1ae52f);
          mCross<double,3u,3u>
                    (in_stack_fffffffffffffb88,
                     (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb80);
          OpenMD::operator*((double)in_stack_fffffffffffffb58,
                            (Vector<double,_3U> *)in_stack_fffffffffffffb50);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffb58,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb50);
          StuntDouble::addTrq(in_stack_fffffffffffffb60,(Vector3d *)in_stack_fffffffffffffb58);
          in_stack_fffffffffffffb88 =
               (RectMatrix<double,_3U,_3U> *)
               doubleDot<double,3u,3u>
                         ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb60,
                          (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb58);
          local_e0 = -(double)in_stack_fffffffffffffb88;
          if ((*(byte *)(in_RDI + 0x12) & 1) != 0) {
            StuntDouble::addParticlePot
                      (in_stack_fffffffffffffb60,(RealType *)in_stack_fffffffffffffb58);
          }
          local_e8 = (Vector<double,_7U> *)(local_e0 + (double)local_e8);
        }
        in_stack_fffffffffffffb80 =
             Molecule::nextAtom((Molecule *)in_stack_fffffffffffffb70,
                                (iterator *)in_stack_fffffffffffffb68);
        local_28 = in_stack_fffffffffffffb80;
      }
      in_stack_fffffffffffffb78 =
           SimInfo::nextMolecule
                     (in_stack_fffffffffffffb70,(MoleculeIterator *)in_stack_fffffffffffffb68);
      local_20 = in_stack_fffffffffffffb78;
    }
    pSVar2 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
    this_00 = SnapshotManager::getCurrentSnapshot(pSVar2);
    Snapshot::getLongRangePotentials(in_stack_fffffffffffffb48);
    Vector<double,_7U>::operator=
              ((Vector<double,_7U> *)in_stack_fffffffffffffb58,
               (Vector<double,_7U> *)in_stack_fffffffffffffb50);
    v = local_e8;
    this_01 = (Vector<double,_7U> *)Vector<double,_7U>::operator[](&local_68,2);
    this_01->data_[0] = this_01->data_[0] + (double)v;
    Vector<double,_7U>::Vector(this_01,v);
    Snapshot::setLongRangePotentials(this_00,(potVec *)in_stack_fffffffffffffb48);
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1ae7e6);
  return;
}

Assistant:

void UniformGradient::modifyForces() {
    if (!initialized) initialize();

    SimInfo::MoleculeIterator i;
    Molecule::AtomIterator j;
    Molecule* mol;
    Atom* atom;
    AtomType* atype;
    potVec longRangePotential(0.0);

    RealType C;
    Vector3d D;
    Mat3x3d Q;

    RealType U;
    RealType fPot;
    Vector3d t;
    Vector3d f;

    Vector3d r;
    Vector3d EF;

    bool isCharge;

    if (doUniformGradient) {
      U    = 0.0;
      fPot = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginAtom(j); atom != NULL; atom = mol->nextAtom(j)) {
          isCharge = false;
          C        = 0.0;

          atype = atom->getAtomType();

          r = atom->getPos();
          info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);

          EF = Grad_ * r;

          atom->addElectricField(EF * Constants::chargeFieldConvert);

          FixedChargeAdapter fca = FixedChargeAdapter(atype);
          if (fca.isFixedCharge()) {
            isCharge = true;
            C        = fca.getCharge();
          }

          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
          if (fqa.isFluctuatingCharge()) {
            isCharge = true;
            C += atom->getFlucQPos();
            atom->addFlucQFrc(dot(r, EF) * Constants::chargeFieldConvert);
          }

          if (isCharge) {
            f = EF * C * Constants::chargeFieldConvert;
            atom->addFrc(f);

            U = -dot(r, f);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }

          MultipoleAdapter ma = MultipoleAdapter(atype);
          if (ma.isDipole()) {
            D = atom->getDipole() * Constants::dipoleFieldConvert;

            f = D * Grad_;
            atom->addFrc(f);

            t = cross(D, EF);
            atom->addTrq(t);

            U = -dot(D, EF);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }

          if (ma.isQuadrupole()) {
            Q = atom->getQuadrupole() * Constants::dipoleFieldConvert;

            t = 2.0 * mCross(Q, Grad_);
            atom->addTrq(t);

            U = -doubleDot(Q, Grad_);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &fPot, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      Snapshot* snap     = info_->getSnapshotManager()->getCurrentSnapshot();
      longRangePotential = snap->getLongRangePotentials();
      longRangePotential[ELECTROSTATIC_FAMILY] += fPot;
      snap->setLongRangePotentials(longRangePotential);
    }
  }